

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O2

void __thiscall
HighsOrbitopeMatrix::determineOrbitopeType(HighsOrbitopeMatrix *this,HighsCliqueTable *cliquetable)

{
  CliqueVar CVar1;
  pointer pcVar2;
  ulong uVar3;
  uint *puVar4;
  HighsInt i_1;
  HighsInt i;
  ulong uVar5;
  ulong uVar6;
  HighsInt j;
  int iVar7;
  long lVar8;
  vector<signed_char,_std::allocator<signed_char>_> *this_00;
  pair<const_HighsCliqueTable::CliqueVar_*,_int> pVar9;
  HighsInt j_1;
  value_type local_6d;
  int local_6c;
  long local_68;
  pointer local_60;
  pointer local_58;
  HighsHashTable<int,_int> *local_50;
  CliqueVar local_48;
  uint local_44;
  vector<signed_char,_std::allocator<signed_char>_> *local_40;
  HighsCliqueTable *local_38;
  
  local_50 = &this->columnToRow;
  local_38 = cliquetable;
  for (lVar8 = 0; lVar8 < this->rowLength; lVar8 = lVar8 + 1) {
    for (local_6c = 0; local_6c < this->numRows; local_6c = local_6c + 1) {
      HighsHashTable<int,int>::insert<int&,int&>
                ((HighsHashTable<int,int> *)local_50,
                 (this->matrix).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + this->numRows * lVar8 + (long)local_6c,&local_6c
                );
    }
  }
  this_00 = &this->rowIsSetPacking;
  local_6d = -1;
  std::vector<signed_char,_std::allocator<signed_char>_>::_M_fill_assign
            (this_00,(long)this->numRows,&local_6d);
  this->numSetPackingRows = 0;
  _j_1 = 1;
  iVar7 = 0;
  local_40 = this_00;
  while (_j_1 < this->rowLength) {
    uVar3 = (ulong)this->numRows;
    local_60 = (this->matrix).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + uVar3 * _j_1;
    local_68 = 0;
    while (local_68 != _j_1) {
      local_58 = (this->matrix).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + (int)uVar3 * local_68;
      for (uVar5 = 0; (long)uVar5 < (long)(int)uVar3; uVar5 = uVar5 + 1) {
        if ((this_00->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar5] == -1) {
          pVar9 = HighsCliqueTable::findCommonClique
                            (local_38,(CliqueVar)(local_58[uVar5] | 0x80000000),
                             (CliqueVar)(local_60[uVar5] | 0x80000000));
          if (pVar9.first == (CliqueVar *)0x0) {
            (this_00->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar5] = '\0';
          }
          else {
            uVar6 = 0;
            uVar3 = (ulong)(uint)pVar9.second;
            if (pVar9.second < 1) {
              uVar3 = uVar6;
            }
            iVar7 = 0;
            for (; uVar3 != uVar6; uVar6 = uVar6 + 1) {
              CVar1 = pVar9.first[uVar6];
              if ((int)CVar1 < 0) {
                local_44 = (uint)CVar1 & 0x7fffffff;
                puVar4 = (uint *)HighsHashTable<int,_int>::find
                                           (local_50,(KeyType_conflict *)&local_44);
                if (puVar4 != (uint *)0x0) {
                  iVar7 = iVar7 + (uint)(uVar5 == *puVar4);
                }
              }
            }
            this_00 = local_40;
            if (iVar7 == this->rowLength) {
              (this->rowIsSetPacking).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar5] = '\x01';
              iVar7 = this->numSetPackingRows + 1;
              this->numSetPackingRows = iVar7;
              if (iVar7 == this->numRows) goto LAB_002f534f;
            }
          }
        }
        uVar3 = (ulong)(uint)this->numRows;
      }
      iVar7 = this->numSetPackingRows;
      local_68 = local_68 + 1;
      if (iVar7 == (int)uVar3) goto LAB_002f534f;
    }
    _j_1 = _j_1 + 1;
    if (iVar7 == (int)uVar3) break;
  }
LAB_002f534f:
  for (lVar8 = 0; uVar3 = (ulong)this->numRows, lVar8 < (long)uVar3; lVar8 = lVar8 + 1) {
    pcVar2 = (this_00->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (pcVar2[lVar8] == '\0') {
      pcVar2[lVar8] = -1;
    }
  }
  _j_1 = 1;
  do {
    if (this->rowLength <= _j_1) {
      return;
    }
    local_60 = (this->matrix).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + (int)uVar3 * _j_1;
    uVar5 = uVar3 & 0xffffffff;
    local_68 = 0;
    do {
      if (local_68 == _j_1) {
        iVar7 = this->numSetPackingRows;
        break;
      }
      local_58 = (this->matrix).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + (int)uVar5 * local_68;
      for (uVar6 = 0; iVar7 = (int)uVar5, (long)uVar6 < (long)iVar7; uVar6 = uVar6 + 1) {
        if ((this_00->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar6] == -1) {
          pVar9 = HighsCliqueTable::findCommonClique
                            (local_38,(CliqueVar)(local_58[uVar6] & 0x7fffffff),
                             (CliqueVar)(local_60[uVar6] & 0x7fffffff));
          if (pVar9.first == (CliqueVar *)0x0) {
            (this_00->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar6] = '\0';
          }
          else {
            uVar5 = 0;
            uVar3 = (ulong)(uint)pVar9.second;
            if (pVar9.second < 1) {
              uVar3 = uVar5;
            }
            iVar7 = 0;
            for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
              CVar1 = pVar9.first[uVar5];
              if ((-1 < (int)CVar1) &&
                 (local_48 = CVar1,
                 puVar4 = (uint *)HighsHashTable<int,_int>::find
                                            (local_50,(KeyType_conflict *)&local_48),
                 puVar4 != (uint *)0x0)) {
                iVar7 = iVar7 + (uint)(uVar6 == *puVar4);
              }
            }
            this_00 = local_40;
            if (iVar7 == this->rowLength) {
              (this->rowIsSetPacking).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar6] = '\x02';
              iVar7 = this->numSetPackingRows + 1;
              this->numSetPackingRows = iVar7;
              if (iVar7 == this->numRows) {
                return;
              }
            }
          }
        }
        uVar3 = (ulong)(uint)this->numRows;
        uVar5 = (ulong)(uint)this->numRows;
      }
      local_68 = local_68 + 1;
    } while (this->numSetPackingRows != iVar7);
    _j_1 = _j_1 + 1;
    if (iVar7 == (int)uVar3) {
      return;
    }
  } while( true );
}

Assistant:

void HighsOrbitopeMatrix::determineOrbitopeType(HighsCliqueTable& cliquetable) {
  for (HighsInt j = 0; j < rowLength; ++j) {
    for (HighsInt i = 0; i < numRows; ++i) {
      columnToRow.insert(entry(i, j), i);
    }
  }

  rowIsSetPacking.assign(numRows, -1);
  numSetPackingRows = 0;

  for (HighsInt j = 1; j < rowLength; ++j) {
    HighsInt* colj1 = &entry(0, j);

    for (HighsInt j0 = 0; j0 < j; ++j0) {
      HighsInt* colj0 = &entry(0, j0);

      for (HighsInt i = 0; i < numRows; ++i) {
        if (rowIsSetPacking[i] != -1) continue;

        HighsInt xj0 = colj0[i];
        HighsInt xj1 = colj1[i];

        auto commonClique = cliquetable.findCommonClique({xj0, 1}, {xj1, 1});

        if (commonClique.first == nullptr) {
          rowIsSetPacking[i] = false;
          continue;
        }

        HighsInt overlap = 0;

        for (HighsInt k = 0; k < commonClique.second; ++k) {
          if (commonClique.first[k].val == 0) continue;

          HighsInt* cliqueColRow = columnToRow.find(commonClique.first[k].col);
          if (cliqueColRow && *cliqueColRow == i) ++overlap;
        }

        if (overlap == rowLength) {
          rowIsSetPacking[i] = true;
          ++numSetPackingRows;
          if (numSetPackingRows == numRows) break;
        }
      }

      if (numSetPackingRows == numRows) break;
    }

    if (numSetPackingRows == numRows) break;
  }

  // now for the rows that do not have a set packing structure check
  // if we have such structure when all columns in the row are negated

  for (HighsInt i = 0; i < numRows; ++i) {
    if (!rowIsSetPacking[i]) rowIsSetPacking[i] = -1;
  }

  for (HighsInt j = 1; j < rowLength; ++j) {
    HighsInt* colj1 = &entry(0, j);

    for (HighsInt j0 = 0; j0 < j; ++j0) {
      HighsInt* colj0 = &entry(0, j0);

      for (HighsInt i = 0; i < numRows; ++i) {
        if (rowIsSetPacking[i] != -1) continue;

        HighsInt xj0 = colj0[i];
        HighsInt xj1 = colj1[i];

        // now look for cliques with value 0
        auto commonClique = cliquetable.findCommonClique({xj0, 0}, {xj1, 0});

        if (commonClique.first == nullptr) {
          rowIsSetPacking[i] = false;
          continue;
        }

        HighsInt overlap = 0;

        for (HighsInt k = 0; k < commonClique.second; ++k) {
          // skip clique variables with values of 1
          if (commonClique.first[k].val == 1) continue;

          HighsInt* cliqueColRow = columnToRow.find(commonClique.first[k].col);
          if (cliqueColRow && *cliqueColRow == i) ++overlap;
        }

        if (overlap == rowLength) {
          // mark with value 2, for negated set packing row with at most one
          // zero
          rowIsSetPacking[i] = 2;
          ++numSetPackingRows;
          if (numSetPackingRows == numRows) break;
        }
      }

      if (numSetPackingRows == numRows) break;
    }

    if (numSetPackingRows == numRows) break;
  }
}